

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O3

OLECHAR __thiscall
UTF8EncodingPolicyBase<false>::ReadSurrogatePairUpper
          (UTF8EncodingPolicyBase<false> *this,EncodedCharPtr *p,EncodedCharPtr last)

{
  byte bVar1;
  byte *pbVar2;
  code *pcVar3;
  bool bVar4;
  char16 cVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  char16 c1;
  
  pbVar2 = *p;
  pbVar7 = pbVar2 + 1;
  *p = pbVar7;
  if (pbVar2 < last) {
    bVar1 = *pbVar2;
    c1 = (char16)bVar1;
    cVar5 = (ushort)bVar1;
    if ((char)bVar1 < '\0') goto LAB_00f02377;
  }
  else {
    cVar5 = L'\0';
  }
  c1 = cVar5;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                     ,0xea,"(IsMultiUnitChar(ch))","IsMultiUnitChar(ch)");
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
  pbVar7 = *p;
LAB_00f02377:
  *(undefined1 *)&this->m_decodeOptions = (char)this->m_decodeOptions | doSecondSurrogatePair;
  cVar5 = utf8::DecodeTail(c1,p,last,&this->m_decodeOptions,(bool *)0x0);
  this->m_cMultiUnits = (size_t)(*p + (this->m_cMultiUnits - (long)pbVar7));
  return cVar5;
}

Assistant:

OLECHAR ReadSurrogatePairUpper(EncodedCharPtr &p, EncodedCharPtr last)
    {
        EncodedChar ch = (nullTerminated || p < last) ? *p++ : (p++, 0);
        Assert(IsMultiUnitChar(ch));
        this->m_decodeOptions |= utf8::DecodeOptions::doSecondSurrogatePair;
        return ReadRest<true>(ch, p, last);
    }